

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderStorageTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_4::max_combined_block_number_limit
               (NegativeTestContext *ctx)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int maxCombinedSSBlocks;
  GLint local_354;
  ProgramSources local_350;
  undefined1 local_280 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270 [6];
  ios_base local_208 [264];
  ProgramSources local_100;
  
  local_280._0_8_ = local_270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_280,"maxCombinedShaderStorageBlocks: Exceed limits","");
  NegativeTestContext::beginSection(ctx,(string *)local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._0_8_ != local_270) {
    operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1);
  }
  local_350.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_350._193_8_ = 0;
  local_350.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_350.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_350.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&local_350,0,0xac);
  local_354 = 0;
  iVar3 = genMaxSSBlocksSource(ctx,0x8b31,&local_350);
  iVar4 = genMaxSSBlocksSource(ctx,0x8b30,&local_350);
  bVar2 = NegativeTestContext::isShaderSupported(ctx,SHADERTYPE_TESSELLATION_CONTROL);
  iVar4 = iVar4 + iVar3;
  if ((bVar2) &&
     (bVar2 = NegativeTestContext::isShaderSupported(ctx,SHADERTYPE_TESSELLATION_EVALUATION), bVar2)
     ) {
    iVar3 = genMaxSSBlocksSource(ctx,0x8e88,&local_350);
    iVar5 = genMaxSSBlocksSource(ctx,0x8e87,&local_350);
    iVar4 = iVar3 + iVar4 + iVar5;
  }
  bVar2 = NegativeTestContext::isShaderSupported(ctx,SHADERTYPE_GEOMETRY);
  if (bVar2) {
    iVar3 = genMaxSSBlocksSource(ctx,0x8dd9,&local_350);
    iVar4 = iVar4 + iVar3;
  }
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x90dc,&local_354);
  local_280._0_8_ = (ctx->super_CallLogWrapper).m_log;
  poVar1 = (ostringstream *)(local_280 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS: ",0x27);
  std::ostream::operator<<(poVar1,local_354);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_208);
  local_280._0_8_ = (ctx->super_CallLogWrapper).m_log;
  poVar1 = (ostringstream *)(local_280 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Combined shader storage blocks: ",0x20);
  std::ostream::operator<<(poVar1,iVar4);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_208);
  if (local_354 < iVar4) {
    lVar6 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&local_100.sources[0].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar6),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&local_350.sources[0].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar6));
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x90);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
              (&local_100.attribLocationBindings,&local_350.attribLocationBindings);
    local_100.transformFeedbackBufferMode = local_350.transformFeedbackBufferMode;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_100.transformFeedbackVaryings,&local_350.transformFeedbackVaryings);
    local_100.separable = local_350.separable;
    verifyProgram(ctx,&local_100);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_100.transformFeedbackVaryings);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_100.attribLocationBindings);
    lVar6 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_100.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar6));
      lVar6 = lVar6 + -0x18;
    } while (lVar6 != -0x18);
  }
  else {
    local_280._0_8_ = (ctx->super_CallLogWrapper).m_log;
    poVar1 = (ostringstream *)(local_280 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Test skipped: Combined shader storage blocks < GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS: "
               ,0x56);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_208);
  }
  NegativeTestContext::endSection(ctx);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_350.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_350.attribLocationBindings);
  lVar6 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_350.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  return;
}

Assistant:

void max_combined_block_number_limit (NegativeTestContext& ctx)
{
	ctx.beginSection("maxCombinedShaderStorageBlocks: Exceed limits");

	glu::ProgramSources sources;

	int combinedSSBlocks	= 0;
	int maxCombinedSSBlocks = 0;

	combinedSSBlocks += genMaxSSBlocksSource(ctx, GL_VERTEX_SHADER, sources);
	combinedSSBlocks += genMaxSSBlocksSource(ctx, GL_FRAGMENT_SHADER, sources);

	if ((ctx.isShaderSupported(glu::SHADERTYPE_TESSELLATION_CONTROL)) && (ctx.isShaderSupported(glu::SHADERTYPE_TESSELLATION_EVALUATION)))
	{
		combinedSSBlocks += genMaxSSBlocksSource(ctx, GL_TESS_CONTROL_SHADER, sources);
		combinedSSBlocks += genMaxSSBlocksSource(ctx, GL_TESS_EVALUATION_SHADER, sources);
	}

	if (ctx.isShaderSupported(glu::SHADERTYPE_GEOMETRY))
		combinedSSBlocks += genMaxSSBlocksSource(ctx, GL_GEOMETRY_SHADER, sources);

	ctx.glGetIntegerv(GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS, &maxCombinedSSBlocks);

	ctx.getLog() << tcu::TestLog::Message << "GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS: " << maxCombinedSSBlocks << tcu::TestLog::EndMessage;
	ctx.getLog() << tcu::TestLog::Message << "Combined shader storage blocks: " << combinedSSBlocks << tcu::TestLog::EndMessage;

	if (combinedSSBlocks > maxCombinedSSBlocks)
		verifyProgram(ctx, sources);
	else
		ctx.getLog() << tcu::TestLog::Message << "Test skipped: Combined shader storage blocks < GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS: " << tcu::TestLog::EndMessage;

	ctx.endSection();
}